

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

ScriptFunction * __thiscall
Js::JavascriptLibrary::CreateScriptFunction(JavascriptLibrary *this,FunctionProxy *proxy)

{
  bool bVar1;
  ScriptFunctionType *pSVar2;
  Recycler *pRVar3;
  JavascriptLibrary *pJVar4;
  ScriptFunctionType *local_100;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_e9;
  TrackAllocData local_e8;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_b9;
  TrackAllocData local_b8;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_89;
  TrackAllocData local_88;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_59;
  TrackAllocData local_58;
  FunctionInfo *local_30;
  FunctionInfo *functionInfo;
  ScriptFunctionType *type;
  FunctionProxy *proxy_local;
  JavascriptLibrary *this_local;
  
  type = (ScriptFunctionType *)proxy;
  proxy_local = (FunctionProxy *)this;
  bVar1 = FunctionProxy::IsClassConstructor(proxy);
  if ((bVar1) &&
     (pSVar2 = FunctionProxy::GetUndeferredFunctionType((FunctionProxy *)type),
     pSVar2 != (ScriptFunctionType *)0x0)) {
    local_100 = FunctionProxy::GetUndeferredFunctionType((FunctionProxy *)type);
  }
  else {
    local_100 = FunctionProxy::EnsureDeferredPrototypeType((FunctionProxy *)type);
  }
  functionInfo = (FunctionInfo *)local_100;
  local_30 = FunctionProxy::GetFunctionInfo((FunctionProxy *)type);
  bVar1 = FunctionInfo::HasComputedName(local_30);
  if ((bVar1) || (bVar1 = FunctionInfo::HasHomeObj(local_30), bVar1)) {
    bVar1 = FunctionInfo::HasComputedName(local_30);
    if ((bVar1) && (bVar1 = FunctionInfo::HasHomeObj(local_30), bVar1)) {
      pRVar3 = GetRecycler(this);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,
                 (type_info *)
                 &FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                 ,0x18e8);
      pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_58);
      pJVar4 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)1>(0x58,pRVar3,&local_59);
      FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_>::
      FunctionWithComputedName
                ((FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)pJVar4,
                 (FunctionProxy *)type,(ScriptFunctionType *)functionInfo);
      this_local = pJVar4;
    }
    else {
      bVar1 = FunctionInfo::HasHomeObj(local_30);
      if (bVar1) {
        pRVar3 = GetRecycler(this);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_88,(type_info *)&FunctionWithHomeObj<Js::ScriptFunction>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                   ,0x18ec);
        pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_88);
        pJVar4 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)1>(0x50,pRVar3,&local_89);
        FunctionWithHomeObj<Js::ScriptFunction>::FunctionWithHomeObj
                  ((FunctionWithHomeObj<Js::ScriptFunction> *)pJVar4,(FunctionProxy *)type,
                   (ScriptFunctionType *)functionInfo);
        this_local = pJVar4;
      }
      else {
        pRVar3 = GetRecycler(this);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_b8,(type_info *)&FunctionWithComputedName<Js::ScriptFunction>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                   ,0x18f0);
        pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_b8);
        pJVar4 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)1>(0x50,pRVar3,&local_b9);
        FunctionWithComputedName<Js::ScriptFunction>::FunctionWithComputedName
                  ((FunctionWithComputedName<Js::ScriptFunction> *)pJVar4,(FunctionProxy *)type,
                   (ScriptFunctionType *)functionInfo);
        this_local = pJVar4;
      }
    }
  }
  else {
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_e8,(type_info *)&ScriptFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x18f2);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_e8);
    pJVar4 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)1>(0x48,pRVar3,&local_e9);
    ScriptFunction::ScriptFunction
              ((ScriptFunction *)pJVar4,(FunctionProxy *)type,(ScriptFunctionType *)functionInfo);
    this_local = pJVar4;
  }
  return (ScriptFunction *)this_local;
}

Assistant:

ScriptFunction* JavascriptLibrary::CreateScriptFunction(FunctionProxy * proxy)
    {
        ScriptFunctionType * type = proxy->IsClassConstructor() && proxy->GetUndeferredFunctionType() ? proxy->GetUndeferredFunctionType() : proxy->EnsureDeferredPrototypeType();
        FunctionInfo* functionInfo = proxy->GetFunctionInfo();
        if (functionInfo->HasComputedName() || functionInfo->HasHomeObj())
        {
            if (functionInfo->HasComputedName() && functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithComputedName<FunctionWithHomeObj<ScriptFunction>>, proxy, type);
            }
            else if (functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithHomeObj<ScriptFunction>, proxy, type);
            }

            // Has computed Name
            return RecyclerNewWithInfoBits(this->GetRecycler(), EnumFunctionClass, ScriptFunctionWithComputedName, proxy, type);
        }
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, ScriptFunction, proxy, type);
    }